

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MinimizeRecGroups.cpp
# Opt level: O0

void __thiscall wasm::anon_unknown_0::GroupClassInfo::advanceBrand(GroupClassInfo *this)

{
  initializer_list<wasm::HeapType> __l;
  initializer_list<wasm::HeapType> __l_00;
  initializer_list<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> __l_01;
  bool bVar1;
  size_type sVar2;
  reference this_00;
  HeapType *pHVar3;
  BrandTypeIterator *pBVar4;
  bool local_161;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_130;
  allocator<wasm::HeapType> local_101;
  HeapType local_100;
  iterator local_f8;
  size_type local_f0;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> local_e8;
  RecGroupShape local_d0;
  byte local_c3;
  byte local_c2;
  allocator<wasm::HeapType> local_c1;
  HeapType local_c0;
  iterator local_b8;
  size_type local_b0;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> local_a8;
  RecGroupShape local_90;
  reference local_88;
  uint *edge;
  iterator __end4;
  iterator __begin4;
  value_type *__range4;
  Index i;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_48;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_30;
  const_iterator local_18;
  GroupClassInfo *local_10;
  GroupClassInfo *this_local;
  
  local_10 = this;
  bVar1 = std::optional::operator_cast_to_bool((optional *)&this->brand);
  if (bVar1) {
    pBVar4 = std::optional<wasm::(anonymous_namespace)::BrandTypeIterator>::operator*(&this->brand);
    BrandTypeIterator::operator++(pBVar4);
  }
  else {
    std::optional<wasm::(anonymous_namespace)::BrandTypeIterator>::emplace<>(&this->brand);
    local_30.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)std::
                  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                  ::begin(&this->subtypeGraph);
    __gnu_cxx::
    __normal_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>const*,std::vector<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>>
    ::__normal_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>*>
              ((__normal_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>const*,std::vector<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>>
                *)&local_18,
               (__normal_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                *)&local_30.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage);
    local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_48);
    local_30.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x1;
    __l_01._M_len = 1;
    __l_01._M_array = &local_48;
    local_30.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)&local_48;
    std::
    vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ::insert(&this->subtypeGraph,local_18,__l_01);
    local_130 = &local_30;
    do {
      local_130 = local_130 + -1;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(local_130);
    } while (local_130 != &local_48);
    for (__range4._4_4_ = 1;
        sVar2 = std::
                vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                ::size(&this->subtypeGraph), __range4._4_4_ < sVar2;
        __range4._4_4_ = __range4._4_4_ + 1) {
      this_00 = std::
                vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                ::operator[](&this->subtypeGraph,(ulong)__range4._4_4_);
      __end4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(this_00);
      edge = (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(this_00);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end4,(__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                                         *)&edge), bVar1) {
        local_88 = __gnu_cxx::
                   __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                   ::operator*(&__end4);
        *local_88 = *local_88 + 1;
        __gnu_cxx::
        __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
        ::operator++(&__end4);
      }
    }
  }
  bVar1 = std::optional::operator_cast_to_bool((optional *)this);
  local_c2 = 0;
  local_c3 = 0;
  local_161 = false;
  if (bVar1) {
    pBVar4 = std::optional<wasm::(anonymous_namespace)::BrandTypeIterator>::operator*(&this->brand);
    local_c0 = BrandTypeIterator::operator*(pBVar4);
    local_b8 = &local_c0;
    local_b0 = 1;
    std::allocator<wasm::HeapType>::allocator(&local_c1);
    local_c2 = 1;
    __l_00._M_len = local_b0;
    __l_00._M_array = local_b8;
    std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::vector(&local_a8,__l_00,&local_c1)
    ;
    local_c3 = 1;
    RecGroupShape::RecGroupShape(&local_90,&local_a8);
    pHVar3 = std::optional<wasm::HeapType>::operator*(&this->singletonType);
    local_100.id = pHVar3->id;
    local_f8 = &local_100;
    local_f0 = 1;
    std::allocator<wasm::HeapType>::allocator(&local_101);
    __l._M_len = local_f0;
    __l._M_array = local_f8;
    std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::vector(&local_e8,__l,&local_101);
    RecGroupShape::RecGroupShape(&local_d0,&local_e8);
    local_161 = RecGroupShape::operator==(&local_90,&local_d0);
    std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::~vector(&local_e8);
    std::allocator<wasm::HeapType>::~allocator(&local_101);
  }
  if ((local_c3 & 1) != 0) {
    std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::~vector(&local_a8);
  }
  if ((local_c2 & 1) != 0) {
    std::allocator<wasm::HeapType>::~allocator(&local_c1);
  }
  if (local_161 != false) {
    pBVar4 = std::optional<wasm::(anonymous_namespace)::BrandTypeIterator>::operator*(&this->brand);
    BrandTypeIterator::operator++(pBVar4);
  }
  TopologicalOrdersImpl<std::monostate>::~TopologicalOrdersImpl(&this->orders);
  TopologicalOrdersImpl<std::monostate>::TopologicalOrdersImpl(&this->orders,&this->subtypeGraph);
  return;
}

Assistant:

void advanceBrand() {
    if (brand) {
      ++*brand;
    } else {
      brand.emplace();
      // Make room in the subtype graph for the brand type, which goes at the
      // beginning of the canonical order.
      subtypeGraph.insert(subtypeGraph.begin(), {{}});
      // Adjust indices.
      for (Index i = 1; i < subtypeGraph.size(); ++i) {
        for (auto& edge : subtypeGraph[i]) {
          ++edge;
        }
      }
    }
    // Make sure the brand is not the same as the real type.
    if (singletonType &&
        RecGroupShape({**brand}) == RecGroupShape({*singletonType})) {
      ++*brand;
    }
    // Start back at the initial permutation with the new brand.
    orders.~TopologicalOrders();
    new (&orders) TopologicalOrders(subtypeGraph);
  }